

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O3

void emulator_get_opcode_mnemonic(u16 opcode,char *buffer,size_t size)

{
  char *__dest;
  char cVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  uint uVar5;
  undefined6 in_register_0000003a;
  char *pcVar6;
  char *pcVar7;
  char fmt [32];
  byte local_69;
  char local_58 [32];
  undefined1 local_38 [8];
  
  uVar5 = (uint)CONCAT62(in_register_0000003a,opcode);
  if (uVar5 < 0x100) {
    local_69 = "\x01\x03\x01\x01\x01\x01\x02\x01\x03\x01\x01\x01\x01\x01\x02\x01\x01\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x03\x01\x02\x01\x01\x01\x03\x02\x03\x03\x02\x01\x01\x01\x03\x01\x03\x01\x02\x01\x01\x01\x03\x01\x03\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x01\x03\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x01\x03\x01\x01\x01\x02\x01"
               [opcode];
    ppcVar3 = s_opcode_mnemonic + opcode;
  }
  else {
    if ((uVar5 & 0xff00) != 0xcb00) {
      __assert_fail("(opcode & 0xff00) == 0xcb00",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator-debug.c"
                    ,0xfb,"void emulator_get_opcode_mnemonic(u16, char *, size_t)");
    }
    ppcVar3 = s_cb_opcode_mnemonic + ((ulong)opcode & 0xff);
    local_69 = 1;
  }
  pcVar7 = *ppcVar3;
  pcVar6 = local_58;
LAB_0010bd00:
  while( true ) {
    while( true ) {
      for (; cVar1 = *pcVar7, cVar1 != '%'; pcVar7 = pcVar7 + 1) {
        if (cVar1 == '\0') {
          *pcVar6 = '\0';
          if (local_69 < 2) {
            strncpy(buffer,local_58,size);
          }
          else {
            if (local_69 == 2) {
              pcVar6 = "XX";
            }
            else {
              if (local_69 != 3) {
                return;
              }
              pcVar6 = "XXXX";
            }
            snprintf(buffer,size,local_58,pcVar6);
          }
          return;
        }
        *pcVar6 = cVar1;
        pcVar6 = pcVar6 + 1;
      }
      __dest = pcVar6 + 1;
      *pcVar6 = '%';
      if (pcVar7[1] == '0') break;
      if (pcVar7[1] != 'h') goto LAB_0010bdc5;
      if (pcVar7[2] != 'u') {
        if ((pcVar7[2] == 'h') && (pcVar7[3] == 'u')) {
          pcVar6[1] = '\0';
          pcVar4 = "-2s";
          goto LAB_0010bdb3;
        }
        goto LAB_0010bdc5;
      }
      pcVar6[1] = '\0';
      strncat(__dest,"4s",(size_t)(local_38 + ~(ulong)__dest));
      pcVar6 = pcVar6 + 3;
      pcVar7 = pcVar7 + 3;
    }
    if ((pcVar7[2] != '4') || (pcVar7[3] != 'x')) break;
    pcVar6[1] = '\0';
    pcVar4 = "-4s";
LAB_0010bdb3:
    strncat(__dest,pcVar4,(size_t)(local_38 + ~(ulong)__dest));
    pcVar6 = pcVar6 + 4;
    pcVar7 = pcVar7 + 4;
  }
LAB_0010bdc5:
  pcVar4 = pcVar7 + 1;
  iVar2 = strncmp(pcVar4,"+hhd",4);
  if (iVar2 == 0) {
    pcVar6[1] = '\0';
    pcVar4 = "2.2s";
  }
  else {
    iVar2 = strncmp(pcVar4,"04hx",4);
    if (iVar2 != 0) {
      iVar2 = strncmp(pcVar4,"02hhx",5);
      if (iVar2 != 0) {
        abort();
      }
      pcVar6[1] = '\0';
      strncat(__dest,"-2.2s",(size_t)(local_38 + ~(ulong)__dest));
      pcVar6 = pcVar6 + 6;
      pcVar7 = pcVar7 + 6;
      goto LAB_0010bd00;
    }
    pcVar6[1] = '\0';
    pcVar4 = "4.4s";
  }
  strncat(__dest,pcVar4,(size_t)(local_38 + ~(ulong)__dest));
  pcVar6 = pcVar6 + 5;
  pcVar7 = pcVar7 + 5;
  goto LAB_0010bd00;
}

Assistant:

void emulator_get_opcode_mnemonic(u16 opcode, char* buffer, size_t size) {
  const char* orig_fmt;
  u8 num_bytes = 1;
  if (opcode >= 0x100) {
    assert((opcode & 0xff00) == 0xcb00);
    orig_fmt = s_cb_opcode_mnemonic[opcode & 0xff];
  } else {
    num_bytes = s_opcode_bytes[opcode];
    orig_fmt = s_opcode_mnemonic[opcode];
  }
  char fmt[32];
  char* dst = fmt;
  const char* src;
  for (src = orig_fmt; *src;) {
    if (*src == '%') {
      *dst++ = *src++;

      /* Replace the format specifier with a string so we can print XXXX
       * instead of numbers. This is super hacky, but eh. */

#define START if (0) ;
#define END else abort();
#define REPLACE(old, new, len)                       \
  else if (strncmp(src, old, len) == 0) {            \
    *dst = 0; /* NULL-terminate so strncat works. */ \
    strncat(dst, new, fmt + sizeof(fmt) - dst - 1);  \
    dst += len;                                      \
    src += len;                                      \
  }

      START
      REPLACE("hu", "4s", 2)
      REPLACE("hhu", "-2s", 3)
      REPLACE("04x", "-4s", 3)
      REPLACE("+hhd", "2.2s", 4)
      REPLACE("04hx", "4.4s", 4)
      REPLACE("02hhx", "-2.2s", 5)
      END

#undef START
#undef END
#undef REPLACE
    } else {
      *dst++ = *src++;
    }
  }